

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-model-loader.cpp
# Opt level: O2

void __thiscall
llama_model_loader::get_mapping_range
          (llama_model_loader *this,size_t *first,size_t *last,void **addr,int idx,ggml_context *ctx
          )

{
  const_reference pvVar1;
  size_t sVar2;
  void *pvVar3;
  long lVar4;
  char *name;
  llama_tensor_weight *plVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  
  if ((this->mappings).
      super__Vector_base<std::unique_ptr<llama_mmap,_std::default_delete<llama_mmap>_>,_std::allocator<std::unique_ptr<llama_mmap,_std::default_delete<llama_mmap>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (this->mappings).
      super__Vector_base<std::unique_ptr<llama_mmap,_std::default_delete<llama_mmap>_>,_std::allocator<std::unique_ptr<llama_mmap,_std::default_delete<llama_mmap>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pvVar1 = std::
             vector<std::unique_ptr<llama_mmap,_std::default_delete<llama_mmap>_>,_std::allocator<std::unique_ptr<llama_mmap,_std::default_delete<llama_mmap>_>_>_>
             ::at(&this->mappings,(long)idx);
    sVar2 = llama_mmap::size((pvVar1->_M_t).
                             super___uniq_ptr_impl<llama_mmap,_std::default_delete<llama_mmap>_>.
                             _M_t.
                             super__Tuple_impl<0UL,_llama_mmap_*,_std::default_delete<llama_mmap>_>.
                             super__Head_base<0UL,_llama_mmap_*,_false>._M_head_impl);
    *first = sVar2;
    *last = 0;
    pvVar3 = llama_mmap::addr((pvVar1->_M_t).
                              super___uniq_ptr_impl<llama_mmap,_std::default_delete<llama_mmap>_>.
                              _M_t.
                              super__Tuple_impl<0UL,_llama_mmap_*,_std::default_delete<llama_mmap>_>
                              .super__Head_base<0UL,_llama_mmap_*,_false>._M_head_impl);
    *addr = pvVar3;
    for (lVar4 = ggml_get_first_tensor(ctx); lVar4 != 0; lVar4 = ggml_get_next_tensor(ctx,lVar4)) {
      name = (char *)ggml_get_name(lVar4);
      plVar5 = get_weight(this,name);
      if ((plVar5 != (llama_tensor_weight *)0x0) && ((uint)plVar5->idx == idx)) {
        uVar8 = plVar5->offs;
        if (*first <= plVar5->offs) {
          uVar8 = *first;
        }
        *first = uVar8;
        sVar2 = plVar5->offs;
        lVar6 = ggml_nbytes(lVar4);
        uVar7 = lVar6 + sVar2;
        uVar8 = *last;
        if (*last <= uVar7) {
          uVar8 = uVar7;
        }
        *last = uVar8;
      }
    }
    return;
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-model-loader.cpp"
             ,0x34d,"GGML_ASSERT(%s) failed","!mappings.empty()");
}

Assistant:

void llama_model_loader::get_mapping_range(size_t * first, size_t * last, void ** addr, int idx, ggml_context * ctx) const {
    GGML_ASSERT(!mappings.empty());
    const auto & mapping = mappings.at(idx);

    *first = mapping->size();
    *last  = 0;
    *addr = mapping->addr();
    for (ggml_tensor * tensor = ggml_get_first_tensor(ctx); tensor; tensor = ggml_get_next_tensor(ctx, tensor)) {
        const auto * weight = get_weight(ggml_get_name(tensor));
        if (!weight || weight->idx != idx) {
            continue;
        }
        *first = std::min(*first, weight->offs);
        *last  = std::max(*last,  weight->offs + ggml_nbytes(tensor));
    }
}